

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  ArrayIndex index;
  Value *this_00;
  Value VStack_38;
  
  Value(&VStack_38,value);
  index = size(this);
  this_00 = operator[](this,index);
  swap(this_00,&VStack_38);
  ~Value(&VStack_38);
  return this_00;
}

Assistant:

Value& Value::append(const Value& value) { return (*this)[size()] = value; }